

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O0

void __thiscall
Octree::Update(Octree *this,shared_ptr<myvk::CommandPool> *command_pool,
              shared_ptr<OctreeBuilder> *builder)

{
  uint32_t uVar1;
  VkDeviceSize VVar2;
  element_type *this_00;
  element_type *peVar3;
  element_type *__r;
  long in_RDI;
  VkDeviceSize in_stack_00000010;
  VkDeviceSize in_stack_00000018;
  uint32_t in_stack_00000020;
  uint32_t in_stack_00000024;
  Ptr<BufferBase> *in_stack_00000028;
  DescriptorSet *in_stack_00000030;
  uint32_t actual_range;
  uint32_t octree_range;
  shared_ptr<myvk::Buffer> *in_stack_ffffffffffffffa8;
  OctreeBuilder *in_stack_ffffffffffffffb0;
  shared_ptr<myvk::BufferBase> local_30;
  uint local_20;
  uint local_1c;
  
  std::__shared_ptr_access<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x167597);
  VVar2 = OctreeBuilder::GetOctreeRange
                    (in_stack_ffffffffffffffb0,
                     (shared_ptr<myvk::CommandPool> *)in_stack_ffffffffffffffa8);
  local_1c = (uint)VVar2;
  this_00 = std::__shared_ptr_access<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1675b2);
  OctreeBuilder::GetOctree(this_00);
  std::shared_ptr<myvk::Buffer>::operator=
            ((shared_ptr<myvk::Buffer> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__shared_ptr_access<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1675d1);
  uVar1 = OctreeBuilder::GetLevel((OctreeBuilder *)0x1675d9);
  *(uint32_t *)(in_RDI + 0x18) = uVar1;
  *(ulong *)(in_RDI + 0x10) = (ulong)local_1c;
  local_20 = local_1c;
  peVar3 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x1675f6);
  VVar2 = myvk::BufferBase::GetSize(&peVar3->super_BufferBase);
  if (VVar2 < local_20) {
    spdlog::error<char[19]>((char (*) [19])0x167613);
    peVar3 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16761d);
    VVar2 = myvk::BufferBase::GetSize(&peVar3->super_BufferBase);
    local_20 = (uint)VVar2;
  }
  __r = std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x167637);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            (&local_30,(shared_ptr<myvk::Buffer> *)__r);
  myvk::DescriptorSet::UpdateStorageBuffer
            (in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000020,
             in_stack_00000018,in_stack_00000010);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x167677);
  return;
}

Assistant:

void Octree::Update(const std::shared_ptr<myvk::CommandPool> &command_pool,
                    const std::shared_ptr<OctreeBuilder> &builder) {
	uint32_t octree_range = builder->GetOctreeRange(command_pool);
	m_buffer = builder->GetOctree();
	m_level = builder->GetLevel();
	m_range = octree_range;

	uint32_t actual_range = octree_range;
	if (m_buffer->GetSize() < actual_range) {
		spdlog::error("Octree size exceed");
		actual_range = m_buffer->GetSize();
	}
	m_descriptor_set->UpdateStorageBuffer(m_buffer, 0, 0, 0, actual_range);
}